

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition.cpp
# Opt level: O3

bool __thiscall Condition::WaitForSeconds(Condition *this,double seconds)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  timeval now;
  timespec stExpireTime;
  timeval local_38;
  timespec local_28;
  
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  local_28.tv_sec = (long)seconds + local_38.tv_sec;
  local_28.tv_nsec = local_38.tv_usec * 1000;
  __mutex = Mutex::GetMutex(this->m_mutex);
  iVar1 = pthread_cond_timedwait
                    ((pthread_cond_t *)&this->m_cond,(pthread_mutex_t *)__mutex,&local_28);
  return iVar1 == 0x6e;
}

Assistant:

bool Condition::WaitForSeconds(double seconds)
{
	struct timespec stExpireTime;
	struct timeval now;
	gettimeofday(&now, NULL);
	//std::cout << "now = " << now.tv_sec << " Nsec = " << now.tv_usec * 1000 << std::endl;
	/*
	const int64_t kNanSecondsPerSecond = 1000000000;
	int64_t addNonSeconds = static_cast<int64_t>(seconds * kNanSecondsPerSecond);

	stExpireTime.tv_sec = static_cast<time_t>(now.tv_sec + (addNonSeconds + stExpireTime.tv_nsec) / kNanSecondsPerSecond);
	stExpireTime.tv_nsec = static_cast<long>(now.tv_usec * 1000 + ((addNonSeconds + stExpireTime.tv_nsec) % kNanSecondsPerSecond));
	*/
	stExpireTime.tv_sec = static_cast<time_t>(now.tv_sec) + static_cast<time_t>(seconds);
	stExpireTime.tv_nsec = static_cast<long>(now.tv_usec * 1000);

	//std::cout << "Expire = " << stExpireTime.tv_sec << " Nsec = " << stExpireTime.tv_nsec << std::endl;
	return ETIMEDOUT == pthread_cond_timedwait(&m_cond, m_mutex.GetMutex(), &stExpireTime);
}